

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_info.cpp
# Opt level: O0

NamesAndLabels * __thiscall
DebugUtilsData::PopulateNamesAndLabels
          (NamesAndLabels *__return_storage_ptr__,DebugUtilsData *this,
          vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *objects)

{
  bool bVar1;
  XrSession_T **ppXVar2;
  vector<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_> local_98;
  vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> local_80;
  XrSdkLogObjectInfo *local_58;
  XrSdkLogObjectInfo *obj;
  iterator __end1;
  iterator __begin1;
  vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *__range1;
  vector<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_> labels;
  vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *objects_local;
  DebugUtilsData *this_local;
  
  labels.super__Vector_base<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)objects;
  std::vector<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_>::vector
            ((vector<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_> *)&__range1);
  __end1 = std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::begin(objects);
  obj = (XrSdkLogObjectInfo *)
        std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::end(objects);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<XrSdkLogObjectInfo_*,_std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>_>
                                *)&obj);
    if (!bVar1) break;
    local_58 = __gnu_cxx::
               __normal_iterator<XrSdkLogObjectInfo_*,_std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>_>
               ::operator*(&__end1);
    ObjectInfoCollection::LookUpObjectName(&this->object_info_,local_58);
    if (local_58->type == XR_OBJECT_TYPE_SESSION) {
      ppXVar2 = XrSdkLogObjectInfo::GetTypedHandle<XrSession_T*>(local_58);
      LookUpSessionLabels(this,*ppXVar2,
                          (vector<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_> *)
                          &__range1);
    }
    __gnu_cxx::
    __normal_iterator<XrSdkLogObjectInfo_*,_std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>_>
    ::operator++(&__end1);
  }
  std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::vector(&local_80,objects);
  std::vector<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_>::vector
            (&local_98,
             (vector<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_> *)&__range1);
  NamesAndLabels::NamesAndLabels(__return_storage_ptr__,&local_80,&local_98);
  std::vector<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_>::~vector(&local_98);
  std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector(&local_80);
  std::vector<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_>::~vector
            ((vector<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_> *)&__range1);
  return __return_storage_ptr__;
}

Assistant:

NamesAndLabels DebugUtilsData::PopulateNamesAndLabels(std::vector<XrSdkLogObjectInfo> objects) const {
    std::vector<XrDebugUtilsLabelEXT> labels;
    for (auto& obj : objects) {
        // Check for any names that have been associated with the objects and set them up here
        object_info_.LookUpObjectName(obj);
        // If this is a session, see if there are any labels associated with it for us to add
        // to the callback content.
        if (XR_OBJECT_TYPE_SESSION == obj.type) {
            LookUpSessionLabels(obj.GetTypedHandle<XrSession>(), labels);
        }
    }

    return {objects, labels};
}